

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  puVar4 = data;
  if (req_comp != img_n) {
    puVar4 = (uchar *)malloc((ulong)(x * req_comp * y));
    if (puVar4 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        iVar6 = req_comp + img_n * 8;
        iVar1 = x - 1;
        uVar11 = 0;
        uVar13 = 0;
        uVar12 = 0;
        do {
          if (iVar6 - 10U < 0x1a) {
            iVar8 = (int)uVar12 * x;
            pbVar10 = data + (uint)(iVar8 * img_n);
            pbVar9 = puVar4 + (uint)(iVar8 * req_comp);
            switch(iVar6) {
            case 10:
              if (-1 < iVar1) {
                lVar7 = 0;
                uVar5 = x;
                do {
                  puVar4[lVar7 * 2 + uVar13] = data[lVar7 + uVar11];
                  puVar4[lVar7 * 2 + uVar13 + 1] = 0xff;
                  uVar5 = uVar5 - 1;
                  lVar7 = lVar7 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                pbVar9 = puVar4 + uVar13 + 2;
                uVar5 = x;
                do {
                  bVar2 = *pbVar10;
                  *pbVar9 = bVar2;
                  pbVar9[-1] = bVar2;
                  pbVar9[-2] = bVar2;
                  pbVar10 = pbVar10 + 1;
                  uVar5 = uVar5 - 1;
                  pbVar9 = pbVar9 + 3;
                } while (0 < (int)uVar5);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar7 = 0;
                uVar5 = x;
                do {
                  uVar3 = data[lVar7 + uVar11];
                  puVar4[lVar7 * 4 + uVar13 + 2] = uVar3;
                  puVar4[lVar7 * 4 + uVar13 + 1] = uVar3;
                  puVar4[lVar7 * 4 + uVar13] = uVar3;
                  puVar4[lVar7 * 4 + uVar13 + 3] = 0xff;
                  uVar5 = uVar5 - 1;
                  lVar7 = lVar7 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar7 = 0;
                uVar5 = x;
                do {
                  puVar4[lVar7 + uVar13] = data[lVar7 * 2 + uVar11];
                  uVar5 = uVar5 - 1;
                  lVar7 = lVar7 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                pbVar9 = puVar4 + uVar13 + 2;
                uVar5 = x;
                do {
                  bVar2 = *pbVar10;
                  *pbVar9 = bVar2;
                  pbVar9[-1] = bVar2;
                  pbVar9[-2] = bVar2;
                  pbVar10 = pbVar10 + 2;
                  uVar5 = uVar5 - 1;
                  pbVar9 = pbVar9 + 3;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar7 = 0;
                uVar5 = x;
                do {
                  uVar3 = data[lVar7 + uVar11];
                  puVar4[lVar7 * 2 + uVar13 + 2] = uVar3;
                  puVar4[lVar7 * 2 + uVar13 + 1] = uVar3;
                  puVar4[lVar7 * 2 + uVar13] = uVar3;
                  puVar4[lVar7 * 2 + uVar13 + 3] = data[lVar7 + uVar11 + 1];
                  uVar5 = uVar5 - 1;
                  lVar7 = lVar7 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x19:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar10[2];
                  *pbVar9 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
                  pbVar10 = pbVar10 + 3;
                  pbVar9 = pbVar9 + 1;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x1a:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar10[2];
                  *pbVar9 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar10[1] * 0x96 + (uint)*pbVar10 * 0x4d >> 8);
                  pbVar9[1] = 0xff;
                  pbVar10 = pbVar10 + 3;
                  pbVar9 = pbVar9 + 2;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x1c:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar9 = *pbVar10;
                  pbVar9[1] = pbVar10[1];
                  pbVar9[2] = pbVar10[2];
                  pbVar9[3] = 0xff;
                  pbVar10 = pbVar10 + 3;
                  pbVar9 = pbVar9 + 4;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar7 = 0;
                uVar5 = x;
                do {
                  bVar2 = data[lVar7 * 4 + uVar11 + 2];
                  puVar4[lVar7 + uVar13] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar7 * 4 + uVar11 + 1] * 0x96 +
                               (uint)data[lVar7 * 4 + uVar11] * 0x4d >> 8);
                  uVar5 = uVar5 - 1;
                  lVar7 = lVar7 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar7 = 0;
                uVar5 = x;
                do {
                  bVar2 = data[lVar7 * 2 + uVar11 + 2];
                  puVar4[lVar7 + uVar13] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar7 * 2 + uVar11 + 1] * 0x96 +
                               (uint)data[lVar7 * 2 + uVar11] * 0x4d >> 8);
                  puVar4[lVar7 + uVar13 + 1] = data[lVar7 * 2 + uVar11 + 3];
                  uVar5 = uVar5 - 1;
                  lVar7 = lVar7 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x23:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar9 = *pbVar10;
                  pbVar9[1] = pbVar10[1];
                  pbVar9[2] = pbVar10[2];
                  pbVar10 = pbVar10 + 4;
                  pbVar9 = pbVar9 + 3;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
            }
          }
          uVar12 = uVar12 + 1;
          uVar13 = (ulong)((int)uVar13 + x * req_comp);
          uVar11 = (ulong)((int)uVar11 + x * img_n);
        } while (uVar12 != y);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc(req_comp * x * y);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define COMBO(a,b)  ((a)*8+(b))
      #define CASE(a,b)   case COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (COMBO(img_n, req_comp)) {
         CASE(1,2) dest[0]=src[0], dest[1]=255; break;
         CASE(1,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(1,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=255; break;
         CASE(2,1) dest[0]=src[0]; break;
         CASE(2,3) dest[0]=dest[1]=dest[2]=src[0]; break;
         CASE(2,4) dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1]; break;
         CASE(3,4) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255; break;
         CASE(3,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(3,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = 255; break;
         CASE(4,1) dest[0]=stbi__compute_y(src[0],src[1],src[2]); break;
         CASE(4,2) dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = src[3]; break;
         CASE(4,3) dest[0]=src[0],dest[1]=src[1],dest[2]=src[2]; break;
         default: STBI_ASSERT(0);
      }
      #undef CASE
   }

   STBI_FREE(data);
   return good;
}